

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int attach_set_initial_delivery_count(ATTACH_HANDLE attach,sequence_no initial_delivery_count_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE initial_delivery_count_amqp_value;
  ATTACH_INSTANCE *attach_instance;
  int result;
  sequence_no initial_delivery_count_value_local;
  ATTACH_HANDLE attach_local;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    attach_instance._0_4_ = 0x12f9;
  }
  else {
    item_value = amqpvalue_create_sequence_no(initial_delivery_count_value);
    if (item_value == (AMQP_VALUE)0x0) {
      attach_instance._0_4_ = 0x1301;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(attach->composite_value,9,item_value);
      if (iVar1 == 0) {
        attach_instance._0_4_ = 0;
      }
      else {
        attach_instance._0_4_ = 0x1307;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return (int)attach_instance;
}

Assistant:

int attach_set_initial_delivery_count(ATTACH_HANDLE attach, sequence_no initial_delivery_count_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        AMQP_VALUE initial_delivery_count_amqp_value = amqpvalue_create_sequence_no(initial_delivery_count_value);
        if (initial_delivery_count_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(attach_instance->composite_value, 9, initial_delivery_count_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(initial_delivery_count_amqp_value);
        }
    }

    return result;
}